

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O0

void __thiscall Imf_3_2::SampleCountChannel::resize(SampleCountChannel *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t sVar4;
  ulong uVar5;
  uint *puVar6;
  size_t *psVar7;
  SampleCountChannel *in_RDI;
  ImageChannel *unaff_retaddr;
  size_t i;
  ulong local_10;
  
  ImageChannel::resize(unaff_retaddr);
  if (in_RDI->_numSamples != (uint *)0x0) {
    operator_delete__(in_RDI->_numSamples);
  }
  if (in_RDI->_sampleListSizes != (uint *)0x0) {
    operator_delete__(in_RDI->_sampleListSizes);
  }
  if (in_RDI->_sampleListPositions != (size_t *)0x0) {
    operator_delete__(in_RDI->_sampleListPositions);
  }
  in_RDI->_numSamples = (uint *)0x0;
  in_RDI->_sampleListSizes = (uint *)0x0;
  in_RDI->_sampleListPositions = (size_t *)0x0;
  sVar4 = ImageChannel::numPixels(&in_RDI->super_ImageChannel);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar4;
  uVar5 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  puVar6 = (uint *)operator_new__(uVar5);
  in_RDI->_numSamples = puVar6;
  sVar4 = ImageChannel::numPixels(&in_RDI->super_ImageChannel);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sVar4;
  uVar5 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  puVar6 = (uint *)operator_new__(uVar5);
  in_RDI->_sampleListSizes = puVar6;
  sVar4 = ImageChannel::numPixels(&in_RDI->super_ImageChannel);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar4;
  uVar5 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  psVar7 = (size_t *)operator_new__(uVar5);
  in_RDI->_sampleListPositions = psVar7;
  resetBasePointer(in_RDI);
  local_10 = 0;
  while( true ) {
    sVar4 = ImageChannel::numPixels(&in_RDI->super_ImageChannel);
    if (sVar4 <= local_10) break;
    in_RDI->_numSamples[local_10] = 0;
    in_RDI->_sampleListSizes[local_10] = 0;
    in_RDI->_sampleListPositions[local_10] = 0;
    local_10 = local_10 + 1;
  }
  in_RDI->_totalNumSamples = 0;
  in_RDI->_totalSamplesOccupied = 0;
  sVar4 = anon_unknown_6::roundBufferSizeUp(in_RDI->_totalSamplesOccupied);
  in_RDI->_sampleBufferSize = sVar4;
  return;
}

Assistant:

void
SampleCountChannel::resize ()
{
    ImageChannel::resize ();

    delete[] _numSamples;
    delete[] _sampleListSizes;
    delete[] _sampleListPositions;

    _numSamples          = 0; // set to 0 to prevent double
    _sampleListSizes     = 0; // deletion in case of an exception
    _sampleListPositions = 0;

    _numSamples          = new unsigned int[numPixels ()];
    _sampleListSizes     = new unsigned int[numPixels ()];
    _sampleListPositions = new size_t[numPixels ()];

    resetBasePointer ();

    for (size_t i = 0; i < numPixels (); ++i)
    {
        _numSamples[i]          = 0;
        _sampleListSizes[i]     = 0;
        _sampleListPositions[i] = 0;
    }

    _totalNumSamples      = 0;
    _totalSamplesOccupied = 0;

    _sampleBufferSize = roundBufferSizeUp (_totalSamplesOccupied);
}